

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O2

environment_params_t * __thiscall
so_5::environment_params_t::add_named_dispatcher
          (environment_params_t *this,nonempty_name_t *name,dispatcher_unique_ptr_t *dispatcher)

{
  dispatcher_t *__p;
  __shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  __p = (dispatcher->_M_t).
        super___uniq_ptr_impl<so_5::dispatcher_t,_std::default_delete<so_5::dispatcher_t>_>._M_t.
        super__Tuple_impl<0UL,_so_5::dispatcher_t_*,_std::default_delete<so_5::dispatcher_t>_>.
        super__Head_base<0UL,_so_5::dispatcher_t_*,_false>._M_head_impl;
  (dispatcher->_M_t).
  super___uniq_ptr_impl<so_5::dispatcher_t,_std::default_delete<so_5::dispatcher_t>_>._M_t.
  super__Tuple_impl<0UL,_so_5::dispatcher_t_*,_std::default_delete<so_5::dispatcher_t>_>.
  super__Head_base<0UL,_so_5::dispatcher_t_*,_false>._M_head_impl = (dispatcher_t *)0x0;
  std::__shared_ptr<so_5::dispatcher_t,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<so_5::dispatcher_t,void>
            ((__shared_ptr<so_5::dispatcher_t,(__gnu_cxx::_Lock_policy)2> *)&local_20,__p);
  this_00 = &std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
             ::operator[](&this->m_named_dispatcher_map,&name->m_nonempty_name)->
             super___shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2>::operator=(this_00,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return this;
}

Assistant:

environment_params_t &
environment_params_t::add_named_dispatcher(
	nonempty_name_t name,
	dispatcher_unique_ptr_t dispatcher )
{
	m_named_dispatcher_map[ name.query_name() ] =
		dispatcher_ref_t( dispatcher.release() );
	return *this;
}